

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsMouseDragging(ImGuiMouseButton button,float lock_threshold)

{
  if (4 < (uint)button) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1131,"bool ImGui::IsMouseDragging(ImGuiMouseButton, float)");
  }
  if ((GImGui->IO).MouseDown[(uint)button] != true) {
    return false;
  }
  if ((uint)button < 5) {
    if (lock_threshold < 0.0) {
      lock_threshold = (GImGui->IO).MouseDragThreshold;
    }
    return lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[(uint)button];
  }
  __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x1128,"bool ImGui::IsMouseDragPastThreshold(ImGuiMouseButton, float)");
}

Assistant:

bool ImGui::IsMouseDragging(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button])
        return false;
    return IsMouseDragPastThreshold(button, lock_threshold);
}